

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_tasking.cpp
# Opt level: O0

void __kmpc_omp_task_complete_if0_template<true>(ident_t *loc_ref,kmp_int32 gtid,kmp_task_t *task)

{
  ompt_frame_t *ompt_frame;
  kmp_taskdata_t *in_stack_00000038;
  kmp_task_t *in_stack_00000040;
  undefined4 in_stack_00000048;
  kmp_int32 in_stack_0000004c;
  ompt_data_t **in_stack_00000050;
  ompt_frame_t **in_stack_00000058;
  ompt_data_t **in_stack_00000060;
  int *in_stack_00000068;
  int in_stack_00000070;
  undefined8 local_20;
  
  __kmp_task_finish<true>(in_stack_0000004c,in_stack_00000040,in_stack_00000038);
  __ompt_get_task_info_internal
            (in_stack_00000070,in_stack_00000068,in_stack_00000060,in_stack_00000058,
             in_stack_00000050,(int *)CONCAT44(in_stack_0000004c,in_stack_00000048));
  *(undefined8 *)(local_20 + 8) = 0;
  *(undefined4 *)(local_20 + 0x14) = 0x20;
  return;
}

Assistant:

static void __kmpc_omp_task_complete_if0_template(ident_t *loc_ref,
                                                  kmp_int32 gtid,
                                                  kmp_task_t *task) {
  KA_TRACE(10, ("__kmpc_omp_task_complete_if0(enter): T#%d loc=%p task=%p\n",
                gtid, loc_ref, KMP_TASK_TO_TASKDATA(task)));
  // this routine will provide task to resume
  __kmp_task_finish<ompt>(gtid, task, NULL);

  KA_TRACE(10, ("__kmpc_omp_task_complete_if0(exit): T#%d loc=%p task=%p\n",
                gtid, loc_ref, KMP_TASK_TO_TASKDATA(task)));

#if OMPT_SUPPORT
  if (ompt) {
    ompt_frame_t *ompt_frame;
    __ompt_get_task_info_internal(0, NULL, NULL, &ompt_frame, NULL, NULL);
    ompt_frame->enter_frame = ompt_data_none;
    ompt_frame->enter_frame_flags = ompt_frame_runtime | ompt_frame_framepointer;
  }
#endif

  return;
}